

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.hh
# Opt level: O1

void __thiscall QPDFCryptoProvider::Members::~Members(Members *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>_>
  ::~_Rb_tree(&(this->providers)._M_t);
  pcVar1 = (this->default_provider)._M_dataplus._M_p;
  paVar2 = &(this->default_provider).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Members() = default;